

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_output_clone_alloc(wally_tx_output *src,wally_tx_output **output)

{
  wally_tx_output *pwVar1;
  int ret;
  wally_tx_output *result;
  wally_tx_output **output_local;
  wally_tx_output *src_local;
  
  if (output == (wally_tx_output **)0x0) {
    src_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx_output *)0x0;
    pwVar1 = (wally_tx_output *)wally_calloc(0x70);
    *output = pwVar1;
    if (*output == (wally_tx_output *)0x0) {
      src_local._4_4_ = -3;
    }
    else {
      pwVar1 = *output;
      src_local._4_4_ = wally_tx_output_clone(src,pwVar1);
      if (src_local._4_4_ != 0) {
        wally_free(pwVar1);
        *output = (wally_tx_output *)0x0;
      }
    }
  }
  return src_local._4_4_;
}

Assistant:

int wally_tx_output_clone_alloc(const struct wally_tx_output *src,
                                struct wally_tx_output **output)
{
    struct wally_tx_output *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_output);

    ret = wally_tx_output_clone(src, result);
    if (ret != WALLY_OK) {
        wally_free(result);
        *output = NULL;
    }
    return ret;
}